

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_opt_params * ggml_opt_default_params(ggml_opt_type type)

{
  int in_ESI;
  ggml_opt_params *in_RDI;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 auStack_9c [28];
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined1 local_48;
  undefined1 local_47;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined1 auStack_28 [40];
  
  if (in_ESI == 0) {
    local_5c = 0;
    local_58 = 1;
    local_54 = 0;
    local_50 = 0x3727c5ac;
    local_4c = 100;
    local_48 = 1;
    local_47 = 1;
    local_44 = 10000;
    local_40 = 0x3a83126f;
    local_3c = 0x3f666666;
    local_38 = 0x3f7fbe77;
    local_34 = 0x322bcc77;
    local_30 = 0x3727c5ac;
    local_2c = 0x3a83126f;
    memset(auStack_28,0,0x24);
    memcpy(in_RDI,&local_5c,0x58);
  }
  else if (in_ESI == 1) {
    local_b4 = 1;
    local_b0 = 1;
    local_ac = 0;
    local_a8 = 0x3727c5ac;
    local_a4 = 0;
    local_a0 = 1;
    local_9f = 1;
    memset(auStack_9c,0,0x1c);
    local_80 = 6;
    local_7c = 100;
    local_78 = 0x14;
    local_74 = 0x3727c5ac;
    local_70 = 0x38d1b717;
    local_6c = 0x3f666666;
    local_68 = 0x1e3ce508;
    local_64 = 0x60ad78ec;
    local_60 = 1;
    memcpy(in_RDI,&local_b4,0x58);
  }
  return in_RDI;
}

Assistant:

struct ggml_opt_params ggml_opt_default_params(enum ggml_opt_type type) {
    struct ggml_opt_params result;

    switch (type) {
        case GGML_OPT_ADAM:
            {
                result = (struct ggml_opt_params) {
                    .type      = GGML_OPT_ADAM,
                    .n_threads = 1,
                    .past      = 0,
                    .delta     = 1e-5f,

                    .max_no_improvement = 100,

                    .print_forward_graph  = true,
                    .print_backward_graph = true,

                    .adam = {
                        .n_iter = 10000,
                        .alpha  = 0.001f,
                        .beta1  = 0.9f,
                        .beta2  = 0.999f,
                        .eps    = 1e-8f,
                        .eps_f  = 1e-5f,
                        .eps_g  = 1e-3f,
                    },
                };
            } break;
        case GGML_OPT_LBFGS:
            {
                result = (struct ggml_opt_params) {
                    .type      = GGML_OPT_LBFGS,
                    .n_threads = 1,
                    .past      = 0,
                    .delta     = 1e-5f,

                    .max_no_improvement = 0,

                    .print_forward_graph  = true,
                    .print_backward_graph = true,

                    .lbfgs = {
                        .m              = 6,
                        .n_iter         = 100,
                        .max_linesearch = 20,

                        .eps      = 1e-5f,
                        .ftol     = 1e-4f,
                        .wolfe    = 0.9f,
                        .min_step = 1e-20f,
                        .max_step = 1e+20f,

                        .linesearch = GGML_LINESEARCH_DEFAULT,
                    },
                };
            } break;
    }

    return result;
}